

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileMutator.cpp
# Opt level: O0

void DynamicProfileMutator::Mutate(FunctionBody *functionBody)

{
  DynamicProfileMutator *pDVar1;
  ScriptContext *this;
  ThreadContext *pTVar2;
  DynamicProfileInfo **ppDVar3;
  Recycler *recycler;
  DynamicProfileInfo *ptr;
  DynamicProfileMutator *dynamicProfileMutator;
  ScriptContext *scriptContext;
  FunctionBody *functionBody_local;
  
  this = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  pTVar2 = Js::ScriptContext::GetThreadContext(this);
  pDVar1 = pTVar2->dynamicProfileMutator;
  if (pDVar1 != (DynamicProfileMutator *)0x0) {
    ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__
                        ((WriteBarrierPtr *)&functionBody->dynamicProfileInfo);
    if (*ppDVar3 == (DynamicProfileInfo *)0x0) {
      recycler = Js::ScriptContext::GetRecycler(this);
      ptr = Js::DynamicProfileInfo::New(recycler,functionBody,false);
      Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator=
                (&functionBody->dynamicProfileInfo,ptr);
    }
    ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__
                        ((WriteBarrierPtr *)&functionBody->dynamicProfileInfo);
    (*(code *)**(undefined8 **)pDVar1)(pDVar1,*ppDVar3);
    Js::DynamicProfileInfo::Save(this);
  }
  return;
}

Assistant:

void
DynamicProfileMutator::Mutate(Js::FunctionBody * functionBody)
{
    Js::ScriptContext * scriptContext = functionBody->GetScriptContext();
    DynamicProfileMutator * dynamicProfileMutator = scriptContext->GetThreadContext()->dynamicProfileMutator;
    if (dynamicProfileMutator != nullptr)
    {
        if (functionBody->dynamicProfileInfo == nullptr)
        {
            functionBody->dynamicProfileInfo = Js::DynamicProfileInfo::New(scriptContext->GetRecycler(), functionBody);
        }

        dynamicProfileMutator->Mutate(functionBody->dynamicProfileInfo);
        // Save the profile information, it will help in case of Crash/Failure
        Js::DynamicProfileInfo::Save(scriptContext);
    }
}